

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Done_Internal(FT_Memory memory,FT_Outline *outline)

{
  FT_Outline *outline_local;
  FT_Memory memory_local;
  
  if (outline == (FT_Outline *)0x0) {
    memory_local._4_4_ = 0x14;
  }
  else if (memory == (FT_Memory)0x0) {
    memory_local._4_4_ = 6;
  }
  else {
    if ((outline->flags & 1U) != 0) {
      ft_mem_free(memory,outline->points);
      outline->points = (FT_Vector *)0x0;
      ft_mem_free(memory,outline->tags);
      outline->tags = (char *)0x0;
      ft_mem_free(memory,outline->contours);
      outline->contours = (short *)0x0;
    }
    memcpy(outline,&null_outline,0x28);
    memory_local._4_4_ = 0;
  }
  return memory_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Done_Internal( FT_Memory    memory,
                            FT_Outline*  outline )
  {
    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !memory )
      return FT_THROW( Invalid_Argument );

    if ( outline->flags & FT_OUTLINE_OWNER )
    {
      FT_FREE( outline->points   );
      FT_FREE( outline->tags     );
      FT_FREE( outline->contours );
    }
    *outline = null_outline;

    return FT_Err_Ok;
  }